

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void __thiscall hmac_hash::sha1(hmac_hash *this,void *data,size_t length,uint8_t *digest)

{
  size_t n;
  EVP_PKEY_CTX *ctx_00;
  pointer d;
  undefined1 local_58 [8];
  SHA1 ctx;
  uint8_t *digest_local;
  size_t length_local;
  void *data_local;
  
  ctx_00 = (EVP_PKEY_CTX *)data;
  ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)length;
  SHA1::SHA1((SHA1 *)local_58,(uchar *)data,length,digest);
  SHA1::init((SHA1 *)local_58,ctx_00);
  SHA1::update((SHA1 *)local_58,(uchar *)this,(size_t)data);
  d = ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage;
  SHA1::finish((SHA1 *)local_58,
               ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  SHA1::~SHA1((SHA1 *)local_58,d,n,digest);
  return;
}

Assistant:

void sha1(const void* data, size_t length, uint8_t* digest) {
        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update(reinterpret_cast<const uint8_t*>(data), length);
        ctx.finish(digest);
    }